

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O2

void __thiscall
QTextDocumentPrivate::clearUndoRedoStacks
          (QTextDocumentPrivate *this,Stacks stacksToClear,bool emitSignals)

{
  QList<QTextUndoCommand> *this_00;
  QTextUndoCommand *pQVar1;
  long *plVar2;
  int i;
  ulong uVar3;
  int i_1;
  long lVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  
  iVar6 = this->undoState;
  this_00 = &this->undoStack;
  if (stacksToClear == UndoStack && iVar6 != 0) {
    lVar8 = 0x10;
    for (lVar4 = 0; lVar4 < iVar6; lVar4 = lVar4 + 1) {
      pQVar1 = (this->undoStack).d.ptr;
      plVar2 = *(long **)((long)&pQVar1->command + lVar8);
      if (plVar2 != (long *)0x0 && (*(byte *)((long)pQVar1 + lVar8 + -0xf) & 1) != 0) {
        (**(code **)(*plVar2 + 8))();
        iVar6 = this->undoState;
      }
      lVar8 = lVar8 + 0x20;
    }
    QList<QTextUndoCommand>::remove(this_00,(char *)0x0);
    this->undoState = 0;
    if (emitSignals) {
      emitUndoAvailable(this,false);
      return;
    }
  }
  else {
    uVar9 = (ulong)iVar6;
    uVar5 = (this->undoStack).d.size;
    if (stacksToClear == RedoStack && uVar5 != uVar9) {
      uVar7 = uVar9 << 5 | 0x10;
      for (; (long)uVar9 < (long)uVar5; uVar9 = uVar9 + 1) {
        pQVar1 = (this->undoStack).d.ptr;
        plVar2 = *(long **)((long)&pQVar1->command + uVar7);
        if (plVar2 != (long *)0x0 && (*(byte *)((long)pQVar1 + (uVar7 - 0xf)) & 1) != 0) {
          (**(code **)(*plVar2 + 8))();
          uVar5 = (this->undoStack).d.size;
        }
        uVar7 = uVar7 + 0x20;
      }
      QList<QTextUndoCommand>::resize(this_00,(long)this->undoState);
      if (emitSignals) {
LAB_0045ebf9:
        emitRedoAvailable(this,false);
        return;
      }
    }
    else if (uVar5 != 0 && stacksToClear == UndoAndRedoStacks) {
      lVar8 = 0x10;
      uVar7 = uVar5;
      for (uVar3 = 0; uVar3 < uVar7; uVar3 = uVar3 + 1) {
        pQVar1 = (this->undoStack).d.ptr;
        plVar2 = *(long **)((long)&pQVar1->command + lVar8);
        if (plVar2 != (long *)0x0 && (*(byte *)((long)pQVar1 + lVar8 + -0xf) & 1) != 0) {
          (**(code **)(*plVar2 + 8))();
          uVar7 = (this->undoStack).d.size;
        }
        lVar8 = lVar8 + 0x20;
      }
      this->undoState = 0;
      QList<QTextUndoCommand>::clear(this_00);
      if (iVar6 != 0 && emitSignals) {
        emitUndoAvailable(this,false);
      }
      if (emitSignals && uVar5 != uVar9) goto LAB_0045ebf9;
    }
  }
  return;
}

Assistant:

void QTextDocumentPrivate::clearUndoRedoStacks(QTextDocument::Stacks stacksToClear,
                                               bool emitSignals)
{
    bool undoCommandsAvailable = undoState != 0;
    bool redoCommandsAvailable = undoState != undoStack.size();
    if (stacksToClear == QTextDocument::UndoStack && undoCommandsAvailable) {
        for (int i = 0; i < undoState; ++i) {
            QTextUndoCommand c = undoStack.at(i);
            if (c.command & QTextUndoCommand::Custom)
                delete c.custom;
        }
        undoStack.remove(0, undoState);
        undoState = 0;
        if (emitSignals)
            emitUndoAvailable(false);
    } else if (stacksToClear == QTextDocument::RedoStack
               && redoCommandsAvailable) {
        for (int i = undoState; i < undoStack.size(); ++i) {
            QTextUndoCommand c = undoStack.at(i);
            if (c.command & QTextUndoCommand::Custom)
                delete c.custom;
        }
        undoStack.resize(undoState);
        if (emitSignals)
            emitRedoAvailable(false);
    } else if (stacksToClear == QTextDocument::UndoAndRedoStacks
               && !undoStack.isEmpty()) {
        for (int i = 0; i < undoStack.size(); ++i) {
            QTextUndoCommand c = undoStack.at(i);
            if (c.command & QTextUndoCommand::Custom)
                delete c.custom;
        }
        undoState = 0;
        undoStack.clear();
        if (emitSignals && undoCommandsAvailable)
            emitUndoAvailable(false);
        if (emitSignals && redoCommandsAvailable)
            emitRedoAvailable(false);
    }
}